

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnCatchAllExpr(BinaryReaderInterp *this)

{
  uint uVar1;
  int iVar2;
  pointer pLVar3;
  pointer pLVar4;
  pointer pHVar5;
  pointer pLVar6;
  Result RVar7;
  Offset OVar8;
  Enum EVar9;
  long lVar10;
  Location loc;
  Location local_98;
  Var local_78;
  
  local_98.field_1.field_0.last_column = 0;
  local_98.filename._M_len = (this->filename_)._M_len;
  local_98.filename._M_str = (this->filename_)._M_str;
  local_98.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  Var::Var(&local_78);
  EVar9 = Error;
  RVar7 = SharedValidator::OnCatch(&this->validator_,&local_98,&local_78,true);
  Var::~Var(&local_78);
  if (RVar7.enum_ != Error) {
    pLVar3 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pLVar4 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar10 = (long)pLVar4 - (long)pLVar3;
    if (lVar10 == 0) {
      __assert_fail("depth < label_stack_.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                    ,0x186,
                    "Label *wabt::interp::(anonymous namespace)::BinaryReaderInterp::GetLabel(Index)"
                   );
    }
    uVar1 = pLVar4[-1].handler_desc_index;
    pHVar5 = (this->func_->handlers).
             super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pHVar5[uVar1].kind = Catch;
    if (pLVar4[-1].kind == Block) {
      Istream::EmitCatchDrop(this->istream_,1);
    }
    iVar2 = *(int *)((long)pLVar3 + lVar10 + -0xc);
    Istream::Emit(this->istream_,Br);
    if (iVar2 != -1) {
      __assert_fail("offset == Istream::kInvalidOffset",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                    ,0x6a6,
                    "virtual Result wabt::interp::(anonymous namespace)::BinaryReaderInterp::OnCatchAllExpr()"
                   );
    }
    pLVar4 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pLVar6 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_start;
    OVar8 = Istream::end(this->istream_);
    FixupMap::Append(&this->depth_fixups_,(int)((ulong)((long)pLVar4 - (long)pLVar6) >> 4) - 1,OVar8
                    );
    Istream::Emit(this->istream_,0xffffffff);
    if (pHVar5[uVar1].try_end_offset == 0xffffffff) {
      OVar8 = Istream::end(this->istream_);
      pHVar5[uVar1].try_end_offset = OVar8;
    }
    *(undefined4 *)((long)pLVar3 + lVar10 + -0x10) = 0;
    OVar8 = Istream::end(this->istream_);
    pHVar5[uVar1].field_4.catch_all_offset = OVar8;
    EVar9 = Ok;
  }
  return (Result)EVar9;
}

Assistant:

Result BinaryReaderInterp::OnCatchAllExpr() {
  CHECK_RESULT(validator_.OnCatch(GetLocation(), Var(), true));
  Label* label = TopLabel();
  HandlerDesc& desc = func_->handlers[label->handler_desc_index];
  desc.kind = HandlerKind::Catch;
  if (label->kind == LabelKind::Block) {
    istream_.EmitCatchDrop(1);
  }
  Istream::Offset offset = label->offset;
  istream_.Emit(Opcode::Br);
  assert(offset == Istream::kInvalidOffset);
  depth_fixups_.Append(label_stack_.size() - 1, istream_.end());
  istream_.Emit(offset);
  if (desc.try_end_offset == Istream::kInvalidOffset) {
    desc.try_end_offset = istream_.end();
  }
  label->kind = LabelKind::Block;
  desc.catch_all_offset = istream_.end();
  return Result::Ok;
}